

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationIterator::nextCE32FromContraction
          (CollationIterator *this,CollationData *d,uint32_t contractionCE32,UChar *p,uint32_t ce32,
          UChar32 c,UErrorCode *errorCode)

{
  SkippedState *pSVar1;
  uint16_t uVar2;
  UStringTrieResult UVar3;
  UChar32 cp;
  int32_t lookAhead;
  int iVar4;
  int n;
  UCharsTrie suffixes;
  
  suffixes.ownedArray_ = (char16_t *)0x0;
  suffixes.remainingMatchLength_ = -1;
  pSVar1 = this->skipped;
  if ((pSVar1 != (SkippedState *)0x0) &&
     (0x1f < (ushort)(pSVar1->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
    (pSVar1->state).uchars = p;
    (pSVar1->state).pos = p;
    (pSVar1->state).remainingMatchLength = -1;
  }
  suffixes.uchars_ = p;
  suffixes.pos_ = p;
  UVar3 = UCharsTrie::firstForCodePoint(&suffixes,c);
  n = 1;
  iVar4 = 2;
  do {
    if ((int)UVar3 < 2) {
      if (UVar3 == USTRINGTRIE_NO_MATCH) break;
      cp = nextSkippedCodePoint(this,errorCode);
      if (cp < 0) break;
      n = n + 1;
    }
    else {
      ce32 = UCharsTrie::getValue(&suffixes);
      if ((UVar3 & USTRINGTRIE_NO_VALUE) == USTRINGTRIE_NO_MATCH) goto LAB_0022fa03;
      cp = nextSkippedCodePoint(this,errorCode);
      if (cp < 0) goto LAB_0022fa03;
      pSVar1 = this->skipped;
      if ((pSVar1 != (SkippedState *)0x0) &&
         (0x1f < (ushort)(pSVar1->oldBuffer).fUnion.fStackFields.fLengthAndFlags)) {
        (pSVar1->state).uchars = suffixes.uchars_;
        (pSVar1->state).pos = suffixes.pos_;
        (pSVar1->state).remainingMatchLength = suffixes.remainingMatchLength_;
      }
      n = 1;
    }
    UVar3 = UCharsTrie::nextForCodePoint(&suffixes,cp);
    iVar4 = iVar4 + 1;
    c = cp;
  } while( true );
  if (((contractionCE32 >> 10 & 1) != 0) &&
     (lookAhead = iVar4 + -1, n < lookAhead || (contractionCE32 >> 8 & 1) == 0)) {
    if (1 < n) {
      backwardNumSkipped(this,n,errorCode);
      c = nextSkippedCodePoint(this,errorCode);
      lookAhead = iVar4 - n;
      n = 1;
    }
    uVar2 = CollationData::getFCD16(d,c);
    if (0xff < uVar2) {
      ce32 = nextCE32FromDiscontiguousContraction(this,d,&suffixes,ce32,lookAhead,c,errorCode);
      goto LAB_0022fa03;
    }
  }
  backwardNumSkipped(this,n,errorCode);
LAB_0022fa03:
  UCharsTrie::~UCharsTrie(&suffixes);
  return ce32;
}

Assistant:

uint32_t
CollationIterator::nextCE32FromContraction(const CollationData *d, uint32_t contractionCE32,
                                           const UChar *p, uint32_t ce32, UChar32 c,
                                           UErrorCode &errorCode) {
    // c: next code point after the original one

    // Number of code points read beyond the original code point.
    // Needed for discontiguous contraction matching.
    int32_t lookAhead = 1;
    // Number of code points read since the last match (initially only c).
    int32_t sinceMatch = 1;
    // Normally we only need a contiguous match,
    // and therefore need not remember the suffixes state from before a mismatch for retrying.
    // If we are already processing skipped combining marks, then we do track the state.
    UCharsTrie suffixes(p);
    if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
    UStringTrieResult match = suffixes.firstForCodePoint(c);
    for(;;) {
        UChar32 nextCp;
        if(USTRINGTRIE_HAS_VALUE(match)) {
            ce32 = (uint32_t)suffixes.getValue();
            if(!USTRINGTRIE_HAS_NEXT(match) || (c = nextSkippedCodePoint(errorCode)) < 0) {
                return ce32;
            }
            if(skipped != NULL && !skipped->isEmpty()) { skipped->saveTrieState(suffixes); }
            sinceMatch = 1;
        } else if(match == USTRINGTRIE_NO_MATCH || (nextCp = nextSkippedCodePoint(errorCode)) < 0) {
            // No match for c, or partial match (USTRINGTRIE_NO_VALUE) and no further text.
            // Back up if necessary, and try a discontiguous contraction.
            if((contractionCE32 & Collation::CONTRACT_TRAILING_CCC) != 0 &&
                    // Discontiguous contraction matching extends an existing match.
                    // If there is no match yet, then there is nothing to do.
                    ((contractionCE32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) == 0 ||
                        sinceMatch < lookAhead)) {
                // The last character of at least one suffix has lccc!=0,
                // allowing for discontiguous contractions.
                // UCA S2.1.1 only processes non-starters immediately following
                // "a match in the table" (sinceMatch=1).
                if(sinceMatch > 1) {
                    // Return to the state after the last match.
                    // (Return to sinceMatch=0 and re-fetch the first partially-matched character.)
                    backwardNumSkipped(sinceMatch, errorCode);
                    c = nextSkippedCodePoint(errorCode);
                    lookAhead -= sinceMatch - 1;
                    sinceMatch = 1;
                }
                if(d->getFCD16(c) > 0xff) {
                    return nextCE32FromDiscontiguousContraction(
                        d, suffixes, ce32, lookAhead, c, errorCode);
                }
            }
            break;
        } else {
            // Continue after partial match (USTRINGTRIE_NO_VALUE) for c.
            // It does not have a result value, therefore it is not itself "a match in the table".
            // If a partially-matched c has ccc!=0 then
            // it might be skipped in discontiguous contraction.
            c = nextCp;
            ++sinceMatch;
        }
        ++lookAhead;
        match = suffixes.nextForCodePoint(c);
    }
    backwardNumSkipped(sinceMatch, errorCode);
    return ce32;
}